

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall
ncnn::Crop::eval_crop_expr
          (Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *_woffset,
          int *_hoffset,int *_doffset,int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pMVar6;
  uint uVar7;
  pointer piVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  vector<int,_std::allocator<int>_> _axes;
  vector<int,_std::allocator<int>_> _ends;
  int _axes4 [4];
  vector<int,_std::allocator<int>_> _starts;
  
  _starts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  _starts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _starts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _ends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  _ends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _ends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  _axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  _axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar9 = eval_list_expression(&this->starts_expr,bottom_blobs,&_starts);
  iVar15 = -1;
  if (((iVar9 == 0) &&
      (iVar9 = eval_list_expression(&this->ends_expr,bottom_blobs,&_ends), iVar9 == 0)) &&
     (iVar9 = eval_list_expression(&this->axes_expr,bottom_blobs,&_axes),
     piVar8 = _starts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start, iVar9 == 0)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar6->dims;
    uVar2 = pMVar6->w;
    uVar3 = pMVar6->h;
    uVar4 = pMVar6->d;
    uVar5 = pMVar6->c;
    *_woffset = 0;
    *_hoffset = 0;
    *_doffset = 0;
    *_coffset = 0;
    *_outw = uVar2;
    *_outh = uVar3;
    *_outd = uVar4;
    *_outc = uVar5;
    _axes4[0] = 0;
    _axes4[1] = 1;
    _axes4[2] = 2;
    _axes4[3] = 3;
    uVar12 = (ulong)((long)_axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)_axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    iVar15 = (int)uVar12;
    if (iVar15 == 0) {
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
    }
    else {
      uVar10 = 0;
      uVar12 = uVar12 & 0xffffffff;
      if (iVar15 < 1) {
        uVar12 = uVar10;
      }
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        _axes4[uVar10] =
             (_axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10] >> 0x1f & uVar1) +
             _axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar10];
      }
    }
    for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
      if (uVar1 - 1 < 4) {
        iVar15 = _axes4[uVar10];
        piVar17 = _outw;
        piVar19 = _woffset;
        uVar14 = uVar2;
        switch(uVar1) {
        case 2:
          piVar17 = _outh;
          piVar16 = _outw;
          piVar19 = _hoffset;
          piVar18 = _woffset;
          uVar14 = uVar3;
          uVar13 = uVar2;
          if (iVar15 != 0) {
LAB_0024f517:
            piVar17 = piVar16;
            piVar19 = piVar18;
            uVar14 = uVar13;
            if (iVar15 != 1) goto switchD_0024f54b_default;
          }
          break;
        case 3:
          piVar17 = _outc;
          piVar19 = _coffset;
          uVar14 = uVar5;
          if ((iVar15 != 0) &&
             (piVar17 = _outw, piVar16 = _outh, piVar19 = _woffset, piVar18 = _hoffset,
             uVar14 = uVar2, uVar13 = uVar3, iVar15 != 2)) goto LAB_0024f517;
          break;
        case 4:
          piVar17 = _outc;
          piVar19 = _coffset;
          uVar14 = uVar5;
          switch(iVar15) {
          case 0:
            break;
          case 1:
            piVar17 = _outd;
            piVar19 = _doffset;
            uVar14 = uVar4;
            break;
          case 2:
            piVar17 = _outh;
            piVar19 = _hoffset;
            uVar14 = uVar3;
            break;
          case 3:
            piVar17 = _outw;
            piVar19 = _woffset;
            uVar14 = uVar2;
            break;
          default:
            goto switchD_0024f54b_default;
          }
        }
        uVar13 = piVar8[uVar10];
        if (piVar8[uVar10] == 0xffffff17) {
          uVar13 = 0;
        }
        uVar7 = _ends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10];
        if (_ends.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10] == 0xffffff17) {
          uVar7 = uVar14;
        }
        iVar15 = ((int)uVar13 >> 0x1f & uVar14) + uVar13;
        *piVar19 = iVar15;
        uVar13 = 0;
        if ((int)uVar7 < 1) {
          uVar13 = uVar14;
        }
        uVar11 = uVar13 + uVar7;
        if ((int)uVar14 <= (int)(uVar13 + uVar7)) {
          uVar11 = uVar14;
        }
        *piVar17 = uVar11 - iVar15;
      }
switchD_0024f54b_default:
    }
    iVar15 = 0;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_axes.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_ends.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_starts.super__Vector_base<int,_std::allocator<int>_>);
  return iVar15;
}

Assistant:

int Crop::eval_crop_expr(const std::vector<Mat>& bottom_blobs, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    std::vector<int> _starts;
    std::vector<int> _ends;
    std::vector<int> _axes;
    int er = eval_list_expression(starts_expr, bottom_blobs, _starts);
    if (er != 0)
        return -1;

    er = eval_list_expression(ends_expr, bottom_blobs, _ends);
    if (er != 0)
        return -1;

    er = eval_list_expression(axes_expr, bottom_blobs, _axes);
    if (er != 0)
        return -1;

    // NCNN_LOGE("%d %d %d", _starts[0], _ends[0], _axes[0]);

    const Mat& bottom_blob = bottom_blobs[0];
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int dims = bottom_blob.dims;

    _woffset = 0;
    _hoffset = 0;
    _doffset = 0;
    _coffset = 0;
    _outw = w;
    _outh = h;
    _outd = d;
    _outc = channels;

    const int* starts_ptr = _starts.data();
    const int* ends_ptr = _ends.data();
    const int* axes_ptr = _axes.data();

    int _axes4[4] = {0, 1, 2, 3};
    int num_axis = (int)_axes.size();
    if (num_axis == 0)
    {
        num_axis = dims;
    }
    else
    {
        for (int i = 0; i < num_axis; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;
            _axes4[i] = axis;
        }
    }

    for (int i = 0; i < num_axis; i++)
    {
        int axis = _axes4[i];
        int start = starts_ptr[i];
        int end = ends_ptr[i];

        if (dims == 1) // axis == 0
        {
            if (start == -233) start = 0;
            if (end == -233) end = w;
            _woffset = start >= 0 ? start : w + start;
            _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
        }
        if (dims == 2)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
        if (dims == 3)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = channels;
                _coffset = start >= 0 ? start : channels + start;
                _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 2)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
        if (dims == 4)
        {
            if (axis == 0)
            {
                if (start == -233) start = 0;
                if (end == -233) end = channels;
                _coffset = start >= 0 ? start : channels + start;
                _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
            }
            if (axis == 1)
            {
                if (start == -233) start = 0;
                if (end == -233) end = d;
                _doffset = start >= 0 ? start : d + start;
                _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
            }
            if (axis == 2)
            {
                if (start == -233) start = 0;
                if (end == -233) end = h;
                _hoffset = start >= 0 ? start : h + start;
                _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
            }
            if (axis == 3)
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
        }
    }

    return 0;
}